

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  int path1;
  Token *pTVar2;
  char *error;
  undefined1 local_f0 [8];
  LocationRecorder end_location_1;
  LocationRecorder end_location;
  undefined1 local_b8 [8];
  LocationRecorder start_location;
  Token start_token;
  int32_t local_60;
  int end;
  int start;
  DescriptorProto_ReservedRange *local_50;
  ReservedRange *range;
  LocationRecorder location;
  bool first;
  LocationRecorder *parent_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_._7_1_ = 1;
  do {
    path1 = DescriptorProto::reserved_range_size(message);
    LocationRecorder::LocationRecorder((LocationRecorder *)&range,parent_location,path1);
    local_50 = DescriptorProto::add_reserved_range(message);
    io::Tokenizer::Token::Token((Token *)&start_location.location_);
    LocationRecorder::LocationRecorder((LocationRecorder *)local_b8,(LocationRecorder *)&range,1);
    pTVar2 = io::Tokenizer::current(this->input_);
    io::Tokenizer::Token::operator=((Token *)&start_location.location_,pTVar2);
    error = "Expected field number range.";
    if ((location.location_._7_1_ & 1) != 0) {
      error = "Expected field name or number range.";
    }
    bVar1 = ConsumeInteger(this,&local_60,error);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    bVar1 = !bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_b8);
    if (!bVar1) {
      bVar1 = TryConsume(this,"to");
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&end_location_1.location_,(LocationRecorder *)&range,2);
        bVar1 = TryConsume(this,"max");
        if (bVar1) {
          start_token._52_4_ = 0xfffffffe;
LAB_00638cb9:
          bVar1 = false;
        }
        else {
          bVar1 = ConsumeInteger(this,(int *)&start_token.field_0x34,"Expected integer.");
          if (bVar1) goto LAB_00638cb9;
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        LocationRecorder::~LocationRecorder((LocationRecorder *)&end_location_1.location_);
        if (bVar1) goto LAB_00638d85;
      }
      else {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_f0,(LocationRecorder *)&range,2);
        LocationRecorder::StartAt((LocationRecorder *)local_f0,(Token *)&start_location.location_);
        LocationRecorder::EndAt((LocationRecorder *)local_f0,(Token *)&start_location.location_);
        start_token._52_4_ = local_60;
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_f0);
      }
      start_token._52_4_ = start_token._52_4_ + 1;
      DescriptorProto_ReservedRange::set_start(local_50,local_60);
      DescriptorProto_ReservedRange::set_end(local_50,start_token._52_4_);
      location.location_._7_1_ = 0;
      bVar1 = false;
    }
LAB_00638d85:
    io::Tokenizer::Token::~Token((Token *)&start_location.location_);
    LocationRecorder::~LocationRecorder((LocationRecorder *)&range);
    if (bVar1) goto LAB_00638e05;
    bVar1 = TryConsume(this,",");
  } while (bVar1);
  bVar1 = ConsumeEndOfDeclaration(this,";",parent_location);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00638e05:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}